

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_util.cpp
# Opt level: O1

void duckdb::ExtensionUtil::RegisterType
               (DatabaseInstance *db,string *type_name,LogicalType *type,
               bind_logical_type_function_t bind_modifiers)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  CatalogTransaction transaction;
  Catalog *this;
  CatalogTransaction data;
  CreateTypeInfo info;
  string local_1f8;
  LogicalType local_1d8;
  CatalogTransaction local_1c0;
  CreateTypeInfo local_198;
  
  local_1f8._M_dataplus._M_p = (type_name->_M_dataplus)._M_p;
  paVar1 = &type_name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p == paVar1) {
    local_1f8.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_1f8.field_2._8_8_ = *(undefined8 *)((long)&type_name->field_2 + 8);
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  }
  else {
    local_1f8.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_1f8._M_string_length = type_name->_M_string_length;
  (type_name->_M_dataplus)._M_p = (pointer)paVar1;
  type_name->_M_string_length = 0;
  (type_name->field_2)._M_local_buf[0] = '\0';
  LogicalType::LogicalType(&local_1d8,type);
  CreateTypeInfo::CreateTypeInfo(&local_198,&local_1f8,&local_1d8,bind_modifiers);
  LogicalType::~LogicalType(&local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p);
  }
  local_198.super_CreateInfo.temporary = true;
  local_198.super_CreateInfo.internal = true;
  this = Catalog::GetSystemCatalog(db);
  CatalogTransaction::GetSystemTransaction(&local_1c0,db);
  transaction.context.ptr = local_1c0.context.ptr;
  transaction.db.ptr = local_1c0.db.ptr;
  transaction.transaction.ptr = local_1c0.transaction.ptr;
  transaction.transaction_id = local_1c0.transaction_id;
  transaction.start_time = local_1c0.start_time;
  Catalog::CreateType(this,transaction,&local_198);
  local_198.super_CreateInfo.super_ParseInfo._vptr_ParseInfo =
       (_func_int **)&PTR__CreateTypeInfo_0247dcb8;
  if (local_198.query.
      super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
      super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
      super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true,_true>)
      0x0) {
    (**(code **)(*(long *)local_198.query.
                          super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>
                          ._M_t.
                          super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>
                          .super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl + 8))()
    ;
  }
  local_198.query.super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>
  ._M_t.super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
  super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl =
       (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>)
       (__uniq_ptr_data<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true,_true>
       )0x0;
  LogicalType::~LogicalType(&local_198.type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198.name._M_dataplus._M_p != &local_198.name.field_2) {
    operator_delete(local_198.name._M_dataplus._M_p);
  }
  CreateInfo::~CreateInfo(&local_198.super_CreateInfo);
  return;
}

Assistant:

void ExtensionUtil::RegisterType(DatabaseInstance &db, string type_name, LogicalType type,
                                 bind_logical_type_function_t bind_modifiers) {
	D_ASSERT(!type_name.empty());
	CreateTypeInfo info(std::move(type_name), std::move(type), bind_modifiers);
	info.temporary = true;
	info.internal = true;
	auto &system_catalog = Catalog::GetSystemCatalog(db);
	auto data = CatalogTransaction::GetSystemTransaction(db);
	system_catalog.CreateType(data, info);
}